

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * luaG_addinfo(lua_State *L,char *msg,TString *src,int line)

{
  char *pcVar1;
  char buff [60];
  
  if (src == (TString *)0x0) {
    buff[0] = '?';
    buff[1] = '\0';
  }
  else {
    luaO_chunkid(buff,(char *)(src + 1),0x3c);
  }
  pcVar1 = luaO_pushfstring(L,"%s:%d: %s",buff,(ulong)(uint)line,msg);
  return pcVar1;
}

Assistant:

const char *luaG_addinfo (lua_State *L, const char *msg, TString *src,
                                        int line) {
  char buff[LUA_IDSIZE];
  if (src)
    luaO_chunkid(buff, getstr(src), LUA_IDSIZE);
  else {  /* no source available; use "?" instead */
    buff[0] = '?'; buff[1] = '\0';
  }
  return luaO_pushfstring(L, "%s:%d: %s", buff, line, msg);
}